

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

string * __thiscall
duckdb::BitpackingModeToString_abi_cxx11_
          (string *__return_storage_ptr__,duckdb *this,BitpackingMode *mode)

{
  NotImplementedException *this_00;
  char *pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_78;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  switch(*this) {
  case (duckdb)0x1:
    pcVar1 = "auto";
    break;
  case (duckdb)0x2:
    pcVar1 = "constant";
    break;
  case (duckdb)0x3:
    pcVar1 = "constant_delta";
    break;
  case (duckdb)0x4:
    pcVar1 = "delta_for";
    break;
  case (duckdb)0x5:
    pcVar1 = "for";
    break;
  default:
    this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::to_string(&local_58,(uint)(byte)*this);
    ::std::operator+(&local_38,"Unknown bitpacking mode: ",&local_58);
    ::std::operator+(&bStack_78,&local_38,anon_var_dwarf_4b0ff16 + 8);
    NotImplementedException::NotImplementedException(this_00,&bStack_78);
    __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,(allocator *)&bStack_78);
  return __return_storage_ptr__;
}

Assistant:

string BitpackingModeToString(const BitpackingMode &mode) {
	switch (mode) {
	case BitpackingMode::AUTO:
		return "auto";
	case BitpackingMode::CONSTANT:
		return "constant";
	case BitpackingMode::CONSTANT_DELTA:
		return "constant_delta";
	case BitpackingMode::DELTA_FOR:
		return "delta_for";
	case BitpackingMode::FOR:
		return "for";
	default:
		throw NotImplementedException("Unknown bitpacking mode: " + to_string((uint8_t)mode) + "\n");
	}
}